

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<void_(double,_double,_mp::var::Type)>::ExplainMatchResultTo
          (TypedExpectation<void_(double,_double,_mp::var::Type)> *this,ArgumentTuple *args,
          ostream *os)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  char *pcVar7;
  ExpectationSet unsatisfied_prereqs;
  string sStack_1e8;
  undefined1 local_1c8 [16];
  _Base_ptr local_1b8;
  _Rb_tree_node_base *local_1b0;
  _Rb_tree_node_base *local_1a8;
  size_t local_1a0;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar2 = ExpectationBase::is_retired((ExpectationBase *)this);
  if (bVar2) {
    os = std::operator<<(os,"         Expected: the expectation is active\n");
    pcVar7 = "           Actual: it is retired\n";
LAB_0015523f:
    std::operator<<(os,pcVar7);
    return;
  }
  bVar2 = Matches(this,args);
  if (bVar2) {
    bVar2 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this);
    if (bVar2) {
      pcVar7 = "The call matches the expectation.\n";
      goto LAB_0015523f;
    }
    poVar4 = std::operator<<(os,"         Expected: all pre-requisites are satisfied\n");
    poVar4 = std::operator<<(poVar4,"           Actual: the following immediate pre-requisites ");
    std::operator<<(poVar4,"are not satisfied:\n");
    p_Var1 = (_Rb_tree_node_base *)(local_1c8 + 8);
    local_1c8._8_4_ = _S_red;
    local_1b8 = (_Base_ptr)0x0;
    local_1a0 = 0;
    local_1b0 = p_Var1;
    local_1a8 = p_Var1;
    ExpectationBase::FindUnsatisfiedPrerequisites
              ((ExpectationBase *)this,(ExpectationSet *)local_1c8);
    iVar6 = 0;
    p_Var5 = local_1b0;
    while (p_Var5 != p_Var1) {
      ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(p_Var5 + 1),os);
      poVar4 = std::operator<<(os,"pre-requisite #");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
      std::operator<<(poVar4,"\n");
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      iVar6 = iVar6 + 1;
    }
    std::operator<<(os,"                   (end of pre-requisites)\n");
    std::
    _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
    ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                 *)local_1c8);
  }
  else {
    bVar2 = TuplePrefix<3ul>::
            Matches<std::tuple<testing::Matcher<double>,testing::Matcher<double>,testing::Matcher<mp::var::Type>>,std::tuple<double,double,mp::var::Type>>
                      ((tuple<testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                        *)(this + 0xf0),args);
    if (!bVar2) {
      TuplePrefix<3ul>::
      ExplainMatchFailuresTo<std::tuple<testing::Matcher<double>,testing::Matcher<double>,testing::Matcher<mp::var::Type>>,std::tuple<double,double,mp::var::Type>>
                ((tuple<testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                  *)(this + 0xf0),args,os);
    }
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1c8);
    cVar3 = (**(code **)(**(long **)(this + 0x140) + 0x20))
                      (*(long **)(this + 0x140),args,(StringMatchResultListener *)local_1c8);
    if (cVar3 == '\0') {
      std::operator<<(os,"    Expected args: ");
      (**(code **)(**(long **)(this + 0x140) + 0x10))(*(long **)(this + 0x140),os);
      std::operator<<(os,"\n           Actual: don\'t match");
      std::__cxx11::stringbuf::str();
      PrintIfNotEmpty(&sStack_1e8,os);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      std::operator<<(os,"\n");
    }
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1c8);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }